

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Synth::processMIDI(V2Synth *this,uint8_t *cmd)

{
  syWRonan *wsptr;
  bool *pbVar1;
  V2ChanInfo *pVVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  V2Sound *pVVar6;
  bool *pbVar7;
  int i_3;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int i_1;
  ulong uVar13;
  uint32_t uVar14;
  int i_4;
  V2Voice *this_00;
  uint uVar15;
  bool bVar16;
  
  wsptr = &this->ronan;
  pbVar1 = &this->voicesw[0].gate;
LAB_00108cd4:
  bVar3 = *cmd;
  uVar11 = (uint)bVar3;
  if (bVar3 == 0xfd) {
    return;
  }
  if ((char)bVar3 < '\0') {
    cmd = cmd + 1;
    this->mrstat = (uint)bVar3;
  }
  else {
    uVar11 = this->mrstat;
  }
  if (uVar11 < 0x80) {
    return;
  }
  uVar15 = uVar11 & 0xf;
  switch(uVar11 >> 4 & 7) {
  case 0:
switchD_00108d16_caseD_0:
    if (uVar15 == 0xf) {
      ronanCBNoteOff((syWRonan *)wsptr);
    }
    pbVar7 = pbVar1;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
      if (((this->chanmap[lVar9] == uVar15) && (((V2Voice *)(pbVar7 + -8))->note == (uint)*cmd)) &&
         (*pbVar7 == true)) {
        *pbVar7 = false;
      }
      pbVar7 = pbVar7 + 0x2d8;
    }
    break;
  case 1:
    if (cmd[1] == 0) goto switchD_00108d16_caseD_0;
    if (uVar15 == 0xf) {
      ronanCBNoteOn((syWRonan *)wsptr);
    }
    pVVar6 = getpatch(this,(uint)this->chans[uVar15].pgm);
    uVar11 = 0;
    for (lVar9 = 5; lVar9 != 0x45; lVar9 = lVar9 + 1) {
      uVar11 = uVar11 + (this->chanmap[lVar9 + -5] == uVar15);
    }
    if ((uVar11 == 0) || (uVar8 = 0xf, uVar10 = uVar15, uVar11 < pVVar6->maxpoly)) {
      for (uVar12 = 0; uVar12 != 0x40; uVar12 = uVar12 + 1) {
        if (this->chanmap[uVar12] < 0) {
          uVar5 = this->curalloc;
          goto LAB_00108f84;
        }
      }
      uVar8 = 0;
      uVar10 = 0;
    }
    uVar5 = this->curalloc;
    uVar12 = 0xffffffffffffffff;
    pbVar7 = pbVar1;
    uVar14 = uVar5;
    for (uVar13 = 0; uVar13 != 0x40; uVar13 = uVar13 + 1) {
      if (((this->chanmap[uVar13] & uVar8) == uVar10) && (*pbVar7 == false)) {
        uVar11 = this->allocpos[uVar13];
        bVar16 = uVar11 < uVar14;
        if (bVar16) {
          uVar14 = uVar11;
        }
        uVar12 = uVar12 & 0xffffffff;
        if (bVar16) {
          uVar12 = uVar13 & 0xffffffff;
        }
      }
      pbVar7 = pbVar7 + 0x2d8;
    }
    if ((int)uVar12 < 0) {
      uVar14 = uVar5;
      for (uVar13 = 0; uVar13 != 0x40; uVar13 = uVar13 + 1) {
        if ((this->chanmap[uVar13] & uVar8) == uVar10) {
          uVar11 = this->allocpos[uVar13];
          bVar16 = uVar11 < uVar14;
          if (bVar16) {
            uVar14 = uVar11;
          }
          uVar12 = uVar12 & 0xffffffff;
          if (bVar16) {
            uVar12 = uVar13 & 0xffffffff;
          }
        }
      }
      if ((int)uVar12 < 0) {
        __assert_fail("usevoice >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                      ,0xb3d,"void V2Synth::processMIDI(const uint8_t *)");
      }
    }
LAB_00108f84:
    uVar13 = uVar12 & 0xffffffff;
    this->chanmap[uVar13] = uVar15;
    this->voicemap[uVar15] = (int)uVar12;
    this->curalloc = uVar5 + 1;
    this->allocpos[uVar13] = uVar5;
    storeV2Values(this,(int)uVar12);
    V2Voice::noteOn(this->voicesw + uVar13,(uint)*cmd,(uint)cmd[1]);
    break;
  case 2:
    cmd = cmd + 1;
    goto LAB_00108cd4;
  case 3:
    bVar3 = *cmd;
    if ((byte)(bVar3 - 1) < 7) {
      bVar4 = cmd[1];
      this->chans[uVar15].ctl[bVar3 - 1] = bVar4;
      if (uVar15 == 0xf) {
        ronanCBSetCtl((syWRonan *)wsptr,(uint)bVar3,(uint)bVar4);
      }
    }
    else if (bVar3 == 0x7b) {
      if (uVar15 == 0xf) {
        ronanCBNoteOff((syWRonan *)wsptr);
      }
      pbVar7 = pbVar1;
      for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
        if (this->chanmap[lVar9] == uVar15) {
          *pbVar7 = false;
        }
        pbVar7 = pbVar7 + 0x2d8;
      }
    }
    else if (bVar3 == 0x78) {
      this_00 = this->voicesw;
      for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
        if (this->chanmap[lVar9] == uVar15) {
          V2Voice::init(this_00,(EVP_PKEY_CTX *)&this->instance);
          this->chanmap[lVar9] = -1;
        }
        this_00 = this_00 + 1;
      }
    }
    break;
  case 4:
    pVVar2 = this->chans + uVar15;
    if (pVVar2->pgm != (*cmd & 0x7f)) {
      pVVar2->pgm = *cmd & 0x7f;
      for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
        if (this->chanmap[lVar9] == uVar15) {
          this->chanmap[lVar9] = -1;
        }
      }
    }
    cmd = cmd + 1;
    for (lVar9 = -6; lVar9 != 0; lVar9 = lVar9 + 1) {
      pVVar2->ctl[lVar9 + 6] = '\0';
    }
    goto LAB_00108cd4;
  case 7:
    goto switchD_00108d16_caseD_7;
  }
  cmd = cmd + 2;
  goto LAB_00108cd4;
switchD_00108d16_caseD_7:
  if (uVar15 == 0xf) {
    init(this,(EVP_PKEY_CTX *)this->patchmap->raw_data);
  }
  goto LAB_00108cd4;
}

Assistant:

void processMIDI(const uint8_t *cmd)
    {
        while (*cmd != 0xfd) // until end of stream
        {
            if (*cmd & 0x80) // start of message
                mrstat = *cmd++;

            if (mrstat < 0x80) // we don't have a current message? uhm...
                break;

            int chan = mrstat & 0xf;
            switch ((mrstat >> 4) & 7)
            {
            case 1: // Note on
                if (cmd[1] != 0) // velocity==0 is actually a note off
                {
                    COVER("MIDI note on");
                    if (chan == CHANS - 1)
                        ronanCBNoteOn(&ronan);

                    // calculate current polyphony for this channel
                    const V2Sound *sound = getpatch(chans[chan].pgm);
                    int npoly = 0;
                    for (int i = 0; i < POLY; i++)
                        npoly += (chanmap[i] == chan);

                    // voice allocation. this is equivalent to the original V2 code,
                    // but hopefully simpler to follow.
                    int usevoice = -1;
                    int chanmask, chanfind;

                    if (!npoly || npoly < sound->maxpoly) // even if maxpoly is 0, allow at least 1.
                    {
                        // if we haven't reached polyphony limit yet, try to find a free voice
                        // first.
                        for (int i=0; i < POLY; i++)
                        {
                            if (chanmap[i] < 0)
                            {
                                usevoice = i;
                                break;
                            }
                        }

                        // okay, need to find a free voice. we'll take any channel.
                        COVER("SYN find voice any");
                        chanmask = 0;
                        chanfind = 0;
                    } else
                    {
                        // if we're at polyphony limit, we know there's at least one voice
                        // used by this channel, so we can limit ourselves to killing
                        // voices from our own chan.
                        COVER("SYN find voice channel");
                        chanmask = 0xf;
                        chanfind = chan;
                    }

                    // don't have a voice yet? kill oldest eligible one with gate off.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice gate off");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && !voicesw[i].gate && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // still no voice? okay, just take the oldest one we can find, period.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice oldest");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // we have our voice - assign it!
                    assert(usevoice >= 0);
                    chanmap[usevoice] = chan;
                    voicemap[chan] = usevoice;
                    allocpos[usevoice] = curalloc++;

                    // and note on!
                    storeV2Values(usevoice);
                    voicesw[usevoice].noteOn(cmd[0], cmd[1]);
                    cmd += 2;
                    break;
                }
                // fall-through (for when we had a note off)

            case 0: // Note off
                COVER("MIDI note off");
                if (chan == CHANS - 1)
                    ronanCBNoteOff(&ronan);

                for (int i = 0; i < POLY; i++)
                {
                    if (chanmap[i] != chan)
                        continue;
                    V2Voice *voice = &voicesw[i];
                    if (voice->note == cmd[0] && voice->gate)
                        voice->noteOff();
                }
                cmd += 2;
                break;

            case 2: // Aftertouch
                COVER("MIDI aftertouch");
                cmd++; // ignored
                break;

            case 3: // Control change
            {
                COVER("MIDI controller change");
                int ctrl = cmd[0];
                uint8_t val = cmd[1];
                if (ctrl >= 1 && ctrl <= 7)
                {
                    chans[chan].ctl[ctrl - 1] = val;
                    if (chan == CHANS-1)
                        ronanCBSetCtl(&ronan, ctrl, val);
                }
                else if (ctrl == 120) // CC #120: all sound off
                {
                    COVER("MIDI CC all sound off");
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] != chan)
                            continue;

                        voicesw[i].init(&instance);
                        chanmap[i] = -1;
                    }
                }
                else if (ctrl == 123) // CC #123: all notes off
                {
                    COVER("MIDI CC all notes off");
                    if (chan == CHANS-1)
                        ronanCBNoteOff(&ronan);

                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            voicesw[i].noteOff();
                    }
                }
                cmd += 2;
                break;
            }

            case 4: // Program change
            {
                COVER("MIDI program change");
                uint8_t pgm = *cmd++ & 0x7f;
                // did the program actually change?
                if (chans[chan].pgm != pgm)
                {
                    COVER("MIDI program change real");
                    chans[chan].pgm = pgm;

                    // need to turn all voices on this channel off.
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            chanmap[i] = -1;
                    }
                }

                // either way, reset controllers
                for (int i=0; i < 6; i++)
                    chans[chan].ctl[i] = 0;
                break;
            }

            case 5: // Pitch bend
                COVER("MIDI pitch bend");
                cmd += 2; // ignored
                break;

            case 6: // Poly Aftertouch
                COVER("MIDI poly aftertouch");
                cmd += 2; // ignored
                break;

            case 7: // System
                COVER("MIDI system exclusive");
                if (chan == 0xf) // Reset
                    init(patchmap, samplerate);
                break; // rest ignored
            }
        }
    }